

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode cf_socket_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  CURLcode CVar2;
  timediff_t tVar3;
  timediff_t tVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  curltime newer;
  curltime older;
  
  if (query - 2U < 7) {
    puVar6 = (uint *)cf->ctx;
    switch(query) {
    case 2:
      tVar4 = 0xffffffff;
      if ((puVar6[0x4d] & 1) != 0) {
        newer._12_4_ = 0;
        newer._0_12_ = *(undefined1 (*) [12])(puVar6 + 0x48);
        older._12_4_ = 0;
        older._0_12_ = *(undefined1 (*) [12])(puVar6 + 0x40);
        tVar3 = Curl_timediff(newer,older);
        tVar4 = 0x7fffffff;
        if (tVar3 < 0x7fffffff) {
          tVar4 = tVar3;
        }
      }
      *pres1 = (int)tVar4;
      break;
    case 3:
      *(uint *)pres2 = puVar6[0x26];
      break;
    case 4:
      if (((*puVar6 & 0xfffffffe) == 4) && ((puVar6[0x4d] & 1) != 0)) {
        uVar7 = puVar6[0x48];
        uVar8 = puVar6[0x49];
        uVar9 = puVar6[0x4a];
        uVar10 = puVar6[0x4b];
      }
      else {
        uVar7 = puVar6[0x44];
        uVar8 = puVar6[0x45];
        uVar9 = puVar6[0x46];
        uVar10 = puVar6[0x47];
      }
      *(uint *)pres2 = uVar7;
      *(uint *)((long)pres2 + 4) = uVar8;
      *(uint *)((long)pres2 + 8) = uVar9;
      *(uint *)((long)pres2 + 0xc) = uVar10;
      break;
    default:
      goto switchD_00116348_caseD_5;
    case 8:
      *pres1 = (uint)(puVar6[2] == 10);
      puVar6 = puVar6 + 0x27;
      for (lVar5 = 0x19; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(uint *)pres2 = *puVar6;
        puVar6 = puVar6 + 1;
        pres2 = (uint *)((long)pres2 + 4);
      }
    }
    CVar2 = CURLE_OK;
  }
  else {
switchD_00116348_caseD_5:
    pCVar1 = cf->next;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      CVar2 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
      return CVar2;
    }
    CVar2 = CURLE_UNKNOWN_OPTION;
  }
  return CVar2;
}

Assistant:

static CURLcode cf_socket_query(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                int query, int *pres1, void *pres2)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  switch(query) {
  case CF_QUERY_SOCKET:
    DEBUGASSERT(pres2);
    *((curl_socket_t *)pres2) = ctx->sock;
    return CURLE_OK;
  case CF_QUERY_CONNECT_REPLY_MS:
    if(ctx->got_first_byte) {
      timediff_t ms = Curl_timediff(ctx->first_byte_at, ctx->started_at);
      *pres1 = (ms < INT_MAX) ? (int)ms : INT_MAX;
    }
    else
      *pres1 = -1;
    return CURLE_OK;
  case CF_QUERY_TIMER_CONNECT: {
    struct curltime *when = pres2;
    switch(ctx->transport) {
    case TRNSPRT_UDP:
    case TRNSPRT_QUIC:
      /* Since UDP connected sockets work different from TCP, we use the
       * time of the first byte from the peer as the "connect" time. */
      if(ctx->got_first_byte) {
        *when = ctx->first_byte_at;
        break;
      }
      FALLTHROUGH();
    default:
      *when = ctx->connected_at;
      break;
    }
    return CURLE_OK;
  }
  case CF_QUERY_IP_INFO:
#ifdef USE_IPV6
    *pres1 = (ctx->addr.family == AF_INET6) ? TRUE : FALSE;
#else
    *pres1 = FALSE;
#endif
    *(struct ip_quadruple *)pres2 = ctx->ip;
    return CURLE_OK;
  default:
    break;
  }
  return cf->next ?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}